

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

int Abc_AigCountNext(Abc_Aig_t *pMan)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  Abc_Obj_t *pAVar6;
  
  uVar1 = pMan->nBins;
  uVar2 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  uVar4 = 0;
  iVar3 = 0;
  for (; uVar2 != uVar5; uVar2 = uVar2 + 1) {
    pAVar6 = pMan->pBins[uVar2];
    while (pAVar6 != (Abc_Obj_t *)0x0) {
      pAVar6 = pAVar6->pNext;
      uVar4 = (uVar4 + 1) - (uint)(pAVar6 == (Abc_Obj_t *)0x0);
      iVar3 = iVar3 + 1;
    }
  }
  printf("Counter = %d.  Nodes = %d.  Ave = %6.2f\n",(double)iVar3 / (double)(int)uVar1,(ulong)uVar4
        );
  return uVar4;
}

Assistant:

int Abc_AigCountNext( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pAnd;
    int i, Counter = 0, CounterTotal = 0;
    // count how many nodes have pNext set
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
        {
            Counter += (pAnd->pNext != NULL);
            CounterTotal++;
        }
    printf( "Counter = %d.  Nodes = %d.  Ave = %6.2f\n", Counter, CounterTotal, 1.0 * CounterTotal/pMan->nBins );
    return Counter;
}